

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
          (SmallVectorBase<slang::Diagnostic> *this,Diagnostic *args)

{
  undefined8 *puVar1;
  _Storage<unsigned_long,_true> *p_Var2;
  size_type sVar3;
  ulong uVar4;
  move_iterator<slang::Diagnostic_*> __first;
  pointer pvVar5;
  pointer pSVar6;
  pointer pDVar7;
  _Storage<unsigned_long,_true> _Var8;
  SourceLocation SVar9;
  _Storage<unsigned_long,_true> _Var10;
  undefined4 uVar11;
  bool bVar12;
  undefined7 uVar13;
  size_type sVar14;
  Diagnostic *__result;
  move_iterator<slang::Diagnostic_*> __last;
  move_iterator<slang::Diagnostic_*> __last_00;
  ulong capacity;
  long lVar15;
  
  __last._M_current = this->data_ + this->len;
  if (this->len == this->cap) {
    if (this->len != 0x7fffffffffffffff) {
      capacity = this->len + 1;
      uVar4 = this->cap;
      if (capacity < uVar4 * 2) {
        capacity = uVar4 * 2;
      }
      if (0x7fffffffffffffff - uVar4 < uVar4) {
        capacity = 0x7fffffffffffffff;
      }
      lVar15 = (long)__last._M_current - (long)this->data_;
      __result = (Diagnostic *)detail::allocArray(capacity,0x70);
      pvVar5 = (args->args).
               super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      *(undefined8 *)((long)__result + lVar15) =
           (args->args).
           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ((undefined8 *)((long)__result + lVar15))[1] = pvVar5;
      *(pointer *)((long)__result + lVar15 + 0x10) =
           (args->args).
           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (args->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (args->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (args->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pSVar6 = (args->ranges).
               super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar1 = (undefined8 *)((long)__result + lVar15 + 0x18);
      *puVar1 = (args->ranges).
                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar1[1] = pSVar6;
      *(pointer *)((long)__result + lVar15 + 0x28) =
           (args->ranges).
           super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pDVar7 = (args->notes).
               super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar1 = (undefined8 *)((long)__result + lVar15 + 0x30);
      *puVar1 = (args->notes).
                super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar1[1] = pDVar7;
      *(pointer *)((long)__result + lVar15 + 0x40) =
           (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(Symbol **)((long)__result + lVar15 + 0x68) = args->symbol;
      _Var8 = (args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload;
      _Var10 = *(_Storage<unsigned_long,_true> *)
                &(args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_engaged;
      SVar9 = args->location;
      puVar1 = (undefined8 *)((long)__result + lVar15 + 0x58);
      *puVar1 = *(undefined8 *)&args->code;
      *(SourceLocation *)(puVar1 + 1) = SVar9;
      p_Var2 = (_Storage<unsigned_long,_true> *)((long)__result + lVar15 + 0x48);
      *p_Var2 = _Var8;
      p_Var2[1] = _Var10;
      __first._M_current = this->data_;
      __last_00._M_current = __first._M_current + this->len;
      if (__last_00._M_current == __last._M_current) {
        std::__uninitialized_copy<false>::
        __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
                  (__first,__last_00,__result);
      }
      else {
        std::__uninitialized_copy<false>::
        __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
                  (__first,__last,__result);
        __last_00._M_current = this->data_ + this->len;
        std::__uninitialized_copy<false>::
        __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
                  (__last,__last_00,(reference)((long)__result + lVar15) + 1);
      }
      cleanup(this,(EVP_PKEY_CTX *)__last_00._M_current);
      this->len = this->len + 1;
      this->cap = capacity;
      this->data_ = __result;
      return (reference)((long)__result + lVar15);
    }
    detail::throwLengthError();
  }
  pvVar5 = (args->args).
           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ((__last._M_current)->args).
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args->args).
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ((__last._M_current)->args).
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar5;
  ((__last._M_current)->args).
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->args).
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->args).
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->args).
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args->args).
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar6 = (args->ranges).
           super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ((__last._M_current)->ranges).
  super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ((__last._M_current)->ranges).
  super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar6;
  ((__last._M_current)->ranges).
  super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (args->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar7 = (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ((__last._M_current)->notes).
  super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ((__last._M_current)->notes).
  super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_finish = pDVar7;
  ((__last._M_current)->notes).
  super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__last._M_current)->symbol = args->symbol;
  _Var8 = (args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload;
  bVar12 = (args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
  uVar13 = *(undefined7 *)
            &(args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>.field_0x9;
  uVar11 = *(undefined4 *)&args->field_0x5c;
  SVar9 = args->location;
  (__last._M_current)->code = args->code;
  *(undefined4 *)&(__last._M_current)->field_0x5c = uVar11;
  (__last._M_current)->location = SVar9;
  ((__last._M_current)->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = _Var8;
  ((__last._M_current)->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = bVar12;
  *(undefined7 *)
   &((__last._M_current)->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>.field_0x9 = uVar13;
  sVar3 = this->len;
  sVar14 = sVar3 + 1;
  this->len = sVar14;
  if (sVar14 != 0) {
    return this->data_ + sVar3;
  }
  assert::assertFailed
            ("len",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
             ,0x62,
             "reference slang::SmallVectorBase<slang::Diagnostic>::back() [T = slang::Diagnostic]");
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }